

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateHashCode
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedImmutablePrimitiveFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (get$capitalized_name$Count() > 0) {\n  hash = (37 * hash) + $constant_name$;\n  hash = (53 * hash) + get$capitalized_name$List().hashCode();\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateHashCode(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "if (get$capitalized_name$Count() > 0) {\n"
      "  hash = (37 * hash) + $constant_name$;\n"
      "  hash = (53 * hash) + get$capitalized_name$List().hashCode();\n"
      "}\n");
}